

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::init_c_to_s(summarycalc *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (this->fout[lVar1] != (FILE *)0x0) {
      this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      this->co_to_s_[lVar1] = this_00;
      std::vector<int,_std::allocator<int>_>::resize
                (this_00,(long)(this->coverages_).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->coverages_).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  return;
}

Assistant:

void summarycalc::init_c_to_s()
{
	for (int i = 0; i < MAX_SUMMARY_SETS; i++) {
		if (fout[i] != nullptr) {
			co_to_s_[i] = new coverage_id_or_output_id_to_Summary_id;
			co_to_s_[i]->resize(coverages_.size());
		}
	}
}